

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_strategy.h
# Opt level: O2

int is_frame_droppable(RTC_REF *rtc_ref,ExtRefreshFrameFlagsInfo *ext_refresh_frame_flags)

{
  uint uVar1;
  uint uVar2;
  
  if (rtc_ref->set_ref_frame_config != 0) {
    return rtc_ref->non_reference_frame;
  }
  uVar1 = 0;
  uVar2 = 0;
  if ((((ext_refresh_frame_flags->update_pending == true) &&
       (uVar2 = uVar1, ext_refresh_frame_flags->alt_ref_frame == false)) &&
      (ext_refresh_frame_flags->alt2_ref_frame == false)) &&
     ((ext_refresh_frame_flags->bwd_ref_frame == false &&
      (ext_refresh_frame_flags->golden_frame == false)))) {
    uVar2 = ext_refresh_frame_flags->last_frame ^ 1;
  }
  return uVar2;
}

Assistant:

static inline int is_frame_droppable(
    const RTC_REF *const rtc_ref,
    const ExtRefreshFrameFlagsInfo *const ext_refresh_frame_flags) {
  // Droppable frame is only used by external refresh flags. VoD setting won't
  // trigger its use case.
  if (rtc_ref->set_ref_frame_config)
    return rtc_ref->non_reference_frame;
  else if (ext_refresh_frame_flags->update_pending)
    return !(ext_refresh_frame_flags->alt_ref_frame ||
             ext_refresh_frame_flags->alt2_ref_frame ||
             ext_refresh_frame_flags->bwd_ref_frame ||
             ext_refresh_frame_flags->golden_frame ||
             ext_refresh_frame_flags->last_frame);
  else
    return 0;
}